

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batcher.c
# Opt level: O1

size_t duckdb_je_batcher_push_begin(tsdn_t *tsdn,batcher_t *batcher,size_t elems_to_push)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  int iVar3;
  size_t sVar4;
  
  sVar4 = 0xffffffffffffffff;
  if ((batcher->nelems).repr + elems_to_push <= batcher->nelems_max) {
    __mutex = (pthread_mutex_t *)((long)&(batcher->mtx).field_0 + 0x48);
    iVar3 = pthread_mutex_trylock(__mutex);
    if (iVar3 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&batcher->mtx);
      (batcher->mtx).field_0.field_0.locked.repr = true;
    }
    puVar1 = &(batcher->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if ((batcher->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (batcher->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar2 = &(batcher->mtx).field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    sVar4 = (batcher->nelems).repr;
    if (batcher->nelems_max < elems_to_push + sVar4) {
      (batcher->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
      sVar4 = 0xffffffffffffffff;
    }
    else {
      (batcher->nelems).repr = elems_to_push + sVar4;
      batcher->npushes = batcher->npushes + 1;
    }
  }
  return sVar4;
}

Assistant:

size_t batcher_push_begin(tsdn_t *tsdn, batcher_t *batcher,
    size_t elems_to_push) {
	assert(elems_to_push > 0);
	size_t nelems_guess = atomic_load_zu(&batcher->nelems, ATOMIC_RELAXED);
	if (nelems_guess + elems_to_push > batcher->nelems_max) {
		return BATCHER_NO_IDX;
	}
	malloc_mutex_lock(tsdn, &batcher->mtx);
	size_t nelems = atomic_load_zu(&batcher->nelems, ATOMIC_RELAXED);
	if (nelems + elems_to_push > batcher->nelems_max) {
		malloc_mutex_unlock(tsdn, &batcher->mtx);
		return BATCHER_NO_IDX;
	}
	assert(elems_to_push <= batcher->nelems_max - nelems);
	/*
	 * We update nelems at push time (instead of during pop) so that other
	 * racing accesses of the batcher can fail fast instead of trying to
	 * acquire a mutex only to discover that there's no space for them.
	 */
	atomic_store_zu(&batcher->nelems, nelems + elems_to_push, ATOMIC_RELAXED);
	batcher->npushes++;
	return nelems;
}